

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.h
# Opt level: O2

void __thiscall Scine::Core::ModuleManager::Impl::load(Impl *this,shared_library *library)

{
  bool bVar1;
  LibraryAndModules lib;
  shared_library_impl local_30;
  LibraryAndModules local_28;
  
  local_30.handle_ = (library->super_shared_library_impl).handle_;
  (library->super_shared_library_impl).handle_ = (native_handle_t)0x0;
  LibraryAndModules::LibraryAndModules(&local_28,(shared_library *)&local_30);
  boost::dll::detail::shared_library_impl::unload(&local_30);
  bVar1 = std::
          any_of<__gnu_cxx::__normal_iterator<std::shared_ptr<Scine::Core::Module>*,std::vector<std::shared_ptr<Scine::Core::Module>,std::allocator<std::shared_ptr<Scine::Core::Module>>>>,Scine::Core::ModuleManager::Impl::load(boost::dll::shared_library)::_lambda(auto:1_const&)_1_>
                    ((__normal_iterator<std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
                      )local_28.modules.
                       super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
                      )local_28.modules.
                       super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                     (anon_class_8_1_8991fb9c_for__M_pred)this);
  if (!bVar1) {
    std::
    vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
    ::emplace_back<Scine::Core::ModuleManager::Impl::LibraryAndModules>(&this->_sources,&local_28);
  }
  LibraryAndModules::~LibraryAndModules(&local_28);
  return;
}

Assistant:

void load(boost::dll::shared_library library) {
    LibraryAndModules lib{std::move(library)};

    const bool alreadyLoaded = std::any_of(std::begin(lib.modules), std::end(lib.modules),
                                           [&](const auto& modulePtr) -> bool { return moduleLoaded(modulePtr->name()); });

    if (!alreadyLoaded) {
      _sources.push_back(std::move(lib));
    }
  }